

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::Functional::ShaderApiTests::init(ShaderApiTests *this,EVP_PKEY_CTX *ctx)

{
  size_type *psVar1;
  Context *pCVar2;
  _func_int **pp_Var3;
  TestNode *pTVar4;
  ApiCase *pAVar5;
  char *pcVar6;
  long *plVar7;
  undefined8 *puVar8;
  ShaderSourceSplitCase *this_00;
  TestNode *pTVar9;
  ProgramStateCase *pPVar10;
  TestNode *pTVar11;
  ProgramBinaryCase *this_01;
  ProgramBinaryUniformResetCase *this_02;
  ProgramBinaryPersistenceCase *pPVar12;
  ulong *extraout_RAX;
  ulong *puVar13;
  int iVar14;
  long *plVar15;
  uint uVar16;
  ulong uVar17;
  int numSlices;
  bool bVar18;
  ShaderType shaderType;
  ShaderType SVar19;
  bool bVar20;
  string caseDesc;
  string caseName;
  string shaderTypeName;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  TestNode *local_200;
  TestNode *local_1f8;
  int local_1f0;
  deUint32 local_1ec;
  long *local_1e8 [2];
  long local_1d8 [12];
  ios_base local_178 [264];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"create_delete","glCreateShader() tests");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pAVar5 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"create_vertex_shader",
                   "Create vertex shader object");
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00cf6910;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pAVar5 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"create_fragment_shader",
                   "Create fragment shader object");
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00cf6910;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pAVar5 = (ApiCase *)operator_new(0xa8);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"delete_vertex_fragment",
                   "Delete vertex shader and fragment shader");
  pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00cf6968;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"compile_link","Compile and link tests");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pAVar5 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"compile_vertex_shader",
                   "Compile vertex shader");
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00cf69e0;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pAVar5 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"compile_fragment_shader",
                   "Compile fragment shader");
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00cf69e0;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pAVar5 = (ApiCase *)operator_new(0xa8);
  ApiCase::ApiCase(pAVar5,(this->super_TestCaseGroup).m_context,"link_vertex_fragment",
                   "Link vertex and fragment shaders");
  pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
  (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00cf6a38;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pAVar5);
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"shader_source","glShaderSource() tests");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  local_200 = pTVar4;
  local_1f8 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  SVar19 = SHADERTYPE_VERTEX;
  bVar20 = true;
  do {
    bVar18 = bVar20;
    pcVar6 = glu::getShaderTypeName(SVar19);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
    local_2e0 = &local_2d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"replace_source_","");
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
    local_2c0 = &local_2b0;
    plVar15 = plVar7 + 2;
    if ((long *)*plVar7 == plVar15) {
      local_2b0 = *plVar15;
      lStack_2a8 = plVar7[3];
    }
    else {
      local_2b0 = *plVar15;
      local_2c0 = (long *)*plVar7;
    }
    local_2b8 = plVar7[1];
    *plVar7 = (long)plVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    local_280 = &local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"Replace source code of ","");
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
    local_2a0 = &local_290;
    plVar15 = plVar7 + 2;
    if ((long *)*plVar7 == plVar15) {
      local_290 = *plVar15;
      lStack_288 = plVar7[3];
    }
    else {
      local_290 = *plVar15;
      local_2a0 = (long *)*plVar7;
    }
    local_298 = plVar7[1];
    *plVar7 = (long)plVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
    local_2e0 = &local_2d0;
    plVar15 = plVar7 + 2;
    if ((long *)*plVar7 == plVar15) {
      local_2d0 = *plVar15;
      lStack_2c8 = plVar7[3];
    }
    else {
      local_2d0 = *plVar15;
      local_2e0 = (long *)*plVar7;
    }
    local_2d8 = plVar7[1];
    *plVar7 = (long)plVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,local_290 + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    pAVar5 = (ApiCase *)operator_new(0xa0);
    ApiCase::ApiCase(pAVar5,(Context *)local_1f8[1]._vptr_TestNode,(char *)local_2c0,
                     (char *)local_2e0);
    (pAVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00cf6a98;
    *(ShaderType *)&pAVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = SVar19;
    tcu::TestNode::addChild(local_200,(TestNode *)pAVar5);
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    SVar19 = SHADERTYPE_FRAGMENT;
    uVar17 = 0;
    bVar20 = false;
  } while (bVar18);
  do {
    iVar14 = (int)uVar17;
    bVar20 = iVar14 != 0;
    local_38 = "_null_terminated";
    if (bVar20) {
      local_38 = "_specify_lengths";
    }
    local_48 = "";
    local_40 = "";
    if (bVar20) {
      local_40 = ", using explicitly specified string lengths";
    }
    local_1ec = (uint)bVar20 + (uint)(iVar14 == 2) * 2;
    if (iVar14 == 2) {
      local_38 = "_random_negative_length";
      local_48 = " with random negative length values";
    }
    iVar14 = 1;
    local_50 = uVar17;
    do {
      numSlices = 1 << ((byte)iVar14 & 0x1f);
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      local_1f0 = iVar14;
      do {
        bVar18 = bVar20;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((ostringstream *)local_1e8,numSlices);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,0xadcd6f);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        iVar14 = 0xb74330;
        if (SVar19 != SHADERTYPE_VERTEX) {
          iVar14 = 0xadcdb7;
        }
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,iVar14,iVar14 + 6 + SVar19 * 2);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_260 = &local_250;
        puVar13 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar13) {
          local_250 = *puVar13;
          lStack_248 = plVar7[3];
        }
        else {
          local_250 = *puVar13;
          local_260 = (ulong *)*plVar7;
        }
        local_258 = plVar7[1];
        *plVar7 = (long)puVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::operator<<((ostringstream *)local_1e8,numSlices);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        uVar17 = 0xf;
        if (local_260 != &local_250) {
          uVar17 = local_250;
        }
        if (uVar17 < (ulong)(local_68 + local_258)) {
          uVar17 = 0xf;
          if (local_70 != local_60) {
            uVar17 = local_60[0];
          }
          if (uVar17 < (ulong)(local_68 + local_258)) goto LAB_00457fb3;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_260);
        }
        else {
LAB_00457fb3:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_70)
          ;
        }
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        psVar1 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_220.field_2._M_allocated_capacity = *psVar1;
          local_220.field_2._8_8_ = puVar8[3];
        }
        else {
          local_220.field_2._M_allocated_capacity = *psVar1;
          local_220._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_220._M_string_length = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_280);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260,local_250 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        this_00 = (ShaderSourceSplitCase *)operator_new(0xb8);
        ShaderSourceSplitCase::ShaderSourceSplitCase
                  (this_00,(Context *)local_1f8[1]._vptr_TestNode,(char *)local_2c0,
                   (char *)local_2e0,SVar19,numSlices,local_1ec);
        tcu::TestNode::addChild(local_200,(TestNode *)this_00);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      iVar14 = local_1f0 + 1;
    } while (iVar14 != 4);
    uVar16 = (int)local_50 + 1;
    uVar17 = (ulong)uVar16;
    if (uVar16 == 3) {
      pTVar9 = (TestNode *)operator_new(0x78);
      pTVar4 = local_1f8;
      pp_Var3 = local_1f8[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"program_state",
                 "Program state persistence tests");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
      pTVar9[1]._vptr_TestNode = pp_Var3;
      tcu::TestNode::addChild(pTVar4,pTVar9);
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"detach_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      local_200 = pTVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"detach shader","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar10 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase
                  (pPVar10,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar10->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_00cf6bf8;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar10);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"reattach_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"reattach shader","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar10 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase
                  (pPVar10,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar10->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_00cf6c58;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar10);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"delete_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"delete shader","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar10 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase
                  (pPVar10,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar10->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_00cf6cb8;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar10);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"replace_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,"replace shader object","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar10 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase
                  (pPVar10,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar10->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_00cf6d18;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar10);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"recompile_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"recompile shader","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar10 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase
                  (pPVar10,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar10->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_00cf6d78;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar10);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"replace_source","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,"replace shader source","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar10 = (ProgramStateCase *)operator_new(0xb0);
        ProgramStateCase::ProgramStateCase
                  (pPVar10,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar10->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ProgramStateCase_00cf6dd8;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar10);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pTVar9 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar4[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"program_binary",
                 "Program binary API tests");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
      pTVar9[1]._vptr_TestNode = pp_Var3;
      tcu::TestNode::addChild(pTVar4,pTVar9);
      pTVar11 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar4[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,(TestContext *)*pp_Var3,"simple","Simple API tests");
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
      pTVar11[1]._vptr_TestNode = pp_Var3;
      tcu::TestNode::addChild(pTVar9,pTVar11);
      this_01 = (ProgramBinaryCase *)operator_new(0xa8);
      ProgramBinaryCase::ProgramBinaryCase
                (this_01,(Context *)pTVar4[1]._vptr_TestNode,"get_program_binary_vertex_fragment",
                 "Get vertex and fragment shader program binary");
      (this_01->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ProgramBinaryCase_00cf6b48;
      tcu::TestNode::addChild(pTVar11,(TestNode *)this_01);
      this_02 = (ProgramBinaryUniformResetCase *)operator_new(0xb8);
      ProgramBinaryUniformResetCase::ProgramBinaryUniformResetCase
                (this_02,(Context *)pTVar4[1]._vptr_TestNode,"uniform_reset_on_binary_load",
                 "Verify uniform reset on successful load of program binary");
      tcu::TestNode::addChild(pTVar11,(TestNode *)this_02);
      pTVar11 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar4[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,(TestContext *)*pp_Var3,"binary_persistence",
                 "Program binary persistence tests");
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
      pTVar11[1]._vptr_TestNode = pp_Var3;
      tcu::TestNode::addChild(pTVar9,pTVar11);
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"detach_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      local_200 = pTVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"detach shader","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar12 = (ProgramBinaryPersistenceCase *)operator_new(0xc0);
        ProgramBinaryPersistenceCase::ProgramBinaryPersistenceCase
                  (pPVar12,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar12->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode = (_func_int **)&PTR__ProgramBinaryPersistenceCase_00cf6e38;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar12);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"reattach_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"reattach shader","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar12 = (ProgramBinaryPersistenceCase *)operator_new(0xc0);
        ProgramBinaryPersistenceCase::ProgramBinaryPersistenceCase
                  (pPVar12,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar12->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode = (_func_int **)&PTR__ProgramBinaryPersistenceCase_00cf6ea0;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar12);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"delete_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"delete shader","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar12 = (ProgramBinaryPersistenceCase *)operator_new(0xc0);
        ProgramBinaryPersistenceCase::ProgramBinaryPersistenceCase
                  (pPVar12,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar12->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode = (_func_int **)&PTR__ProgramBinaryPersistenceCase_00cf6f08;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar12);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"replace_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,"replace shader object","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar12 = (ProgramBinaryPersistenceCase *)operator_new(0xc0);
        ProgramBinaryPersistenceCase::ProgramBinaryPersistenceCase
                  (pPVar12,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar12->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode = (_func_int **)&PTR__ProgramBinaryPersistenceCase_00cf6f70;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar12);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"recompile_shader","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"recompile shader","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar12 = (ProgramBinaryPersistenceCase *)operator_new(0xc0);
        ProgramBinaryPersistenceCase::ProgramBinaryPersistenceCase
                  (pPVar12,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar12->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode = (_func_int **)&PTR__ProgramBinaryPersistenceCase_00cf6fd8;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar12);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        pTVar4 = local_1f8;
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"replace_source","");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,"replace shader source","");
      SVar19 = SHADERTYPE_VERTEX;
      bVar20 = true;
      do {
        bVar18 = bVar20;
        pcVar6 = glu::getShaderTypeName(SVar19);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,pcVar6,(allocator<char> *)&local_2c0);
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_260,local_258 + (long)local_260);
        std::__cxx11::string::append((char *)&local_2e0);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e8[0]);
        local_2c0 = &local_2b0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2b0 = *plVar15;
          lStack_2a8 = plVar7[3];
        }
        else {
          local_2b0 = *plVar15;
          local_2c0 = (long *)*plVar7;
        }
        local_2b8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        std::operator+(&local_220,"Build program, ",&local_240);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_280 = &local_270;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_270 = *plVar15;
          lStack_268 = plVar7[3];
        }
        else {
          local_270 = *plVar15;
          local_280 = (long *)*plVar7;
        }
        local_278 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1e8[0]);
        local_2a0 = &local_290;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_290 = *plVar15;
          lStack_288 = plVar7[3];
        }
        else {
          local_290 = *plVar15;
          local_2a0 = (long *)*plVar7;
        }
        local_298 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_2e0 = &local_2d0;
        plVar15 = plVar7 + 2;
        if ((long *)*plVar7 == plVar15) {
          local_2d0 = *plVar15;
          lStack_2c8 = plVar7[3];
        }
        else {
          local_2d0 = *plVar15;
          local_2e0 = (long *)*plVar7;
        }
        local_2d8 = plVar7[1];
        *plVar7 = (long)plVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pPVar12 = (ProgramBinaryPersistenceCase *)operator_new(0xc0);
        ProgramBinaryPersistenceCase::ProgramBinaryPersistenceCase
                  (pPVar12,pCVar2,(char *)local_2c0,(char *)local_2e0,SVar19);
        (pPVar12->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode = (_func_int **)&PTR__ProgramBinaryPersistenceCase_00cf7040;
        tcu::TestNode::addChild(local_200,(TestNode *)pPVar12);
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        SVar19 = SHADERTYPE_FRAGMENT;
        bVar20 = false;
      } while (bVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      puVar13 = &local_250;
      if (local_260 != puVar13) {
        operator_delete(local_260,local_250 + 1);
        puVar13 = extraout_RAX;
      }
      return (int)puVar13;
    }
  } while( true );
}

Assistant:

void ShaderApiTests::init (void)
{
	// create and delete shaders
	{
		TestCaseGroup* createDeleteGroup = new TestCaseGroup(m_context, "create_delete", "glCreateShader() tests");
		addChild(createDeleteGroup);

		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_vertex_shader",		"Create vertex shader object",		glu::SHADERTYPE_VERTEX));
		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_fragment_shader",	"Create fragment shader object",	glu::SHADERTYPE_FRAGMENT));

		createDeleteGroup->addChild(new DeleteShaderCase(m_context,	"delete_vertex_fragment",	"Delete vertex shader and fragment shader"));
	}

	// compile and link
	{
		TestCaseGroup* compileLinkGroup = new TestCaseGroup(m_context, "compile_link", "Compile and link tests");
		addChild(compileLinkGroup);

		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_vertex_shader",	"Compile vertex shader",	glu::SHADERTYPE_VERTEX));
		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_fragment_shader",	"Compile fragment shader",	glu::SHADERTYPE_FRAGMENT));

		compileLinkGroup->addChild(new LinkVertexFragmentCase(m_context,	"link_vertex_fragment",	"Link vertex and fragment shaders"));
	}

	// shader source
	{
		TestCaseGroup* shaderSourceGroup = new TestCaseGroup(m_context, "shader_source", "glShaderSource() tests");
		addChild(shaderSourceGroup);

		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType		= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;
			const std::string		shaderTypeName	= getShaderTypeName(shaderType);

			const std::string		caseName		= std::string("replace_source_") + shaderTypeName;
			const std::string		caseDesc		= std::string("Replace source code of ") + shaderTypeName + " shader.";

			shaderSourceGroup->addChild(new ShaderSourceReplaceCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType));
		}

		for (int stringLengthsInt	= 0; stringLengthsInt < 3; stringLengthsInt++)
		for (int caseNdx = 1; caseNdx <= 3; caseNdx++)
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const int				numSlices		= 1 << caseNdx;
			const glu::ShaderType	shaderType		= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;

			const bool				explicitLengths	= (stringLengthsInt != 0);
			const bool				randomNullTerm	= (stringLengthsInt == 2);

			const deUint32			flags			= (explicitLengths	? CASE_EXPLICIT_SOURCE_LENGTHS	: 0)
													| (randomNullTerm	? CASE_RANDOM_NULL_TERMINATED	: 0);

			const std::string		caseName		= "split_source_"
													+ de::toString(numSlices)
													+ (randomNullTerm ? "_random_negative_length" : (explicitLengths ? "_specify_lengths" : "_null_terminated"))
													+ ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "_fragment" : "_vertex");

			const std::string		caseDesc		= std::string((shaderType == glu::SHADERTYPE_FRAGMENT) ? "Fragment" : "Vertex")
													+ " shader source split into "
													+ de::toString(numSlices)
													+ " pieces"
													+ (explicitLengths ? ", using explicitly specified string lengths" : "")
													+ (randomNullTerm ? " with random negative length values" : "");

			shaderSourceGroup->addChild(new ShaderSourceSplitCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType, numSlices, flags));
		}
	}

	// link status and infolog
	{
		TestCaseGroup* linkStatusGroup = new TestCaseGroup(m_context, "program_state", "Program state persistence tests");
		addChild(linkStatusGroup);

		addProgramStateCase<ProgramStateDetachShaderCase>		(linkStatusGroup,	m_context,	"detach_shader",	"detach shader");
		addProgramStateCase<ProgramStateReattachShaderCase>		(linkStatusGroup,	m_context,	"reattach_shader",	"reattach shader");
		addProgramStateCase<ProgramStateDeleteShaderCase>		(linkStatusGroup,	m_context,	"delete_shader",	"delete shader");
		addProgramStateCase<ProgramStateReplaceShaderCase>		(linkStatusGroup,	m_context,	"replace_shader",	"replace shader object");
		addProgramStateCase<ProgramStateRecompileShaderCase>	(linkStatusGroup,	m_context,	"recompile_shader",	"recompile shader");
		addProgramStateCase<ProgramStateReplaceSourceCase>		(linkStatusGroup,	m_context,	"replace_source",	"replace shader source");
	}

	// program binary
	{
		TestCaseGroup* programBinaryGroup = new TestCaseGroup(m_context, "program_binary", "Program binary API tests");
		addChild(programBinaryGroup);

		{
			TestCaseGroup* simpleCaseGroup = new TestCaseGroup(m_context, "simple", "Simple API tests");
			programBinaryGroup->addChild(simpleCaseGroup);

			simpleCaseGroup->addChild(new ProgramBinarySimpleCase		(m_context,	"get_program_binary_vertex_fragment",	"Get vertex and fragment shader program binary"));
			simpleCaseGroup->addChild(new ProgramBinaryUniformResetCase	(m_context,	"uniform_reset_on_binary_load",			"Verify uniform reset on successful load of program binary"));
		}

		{
			TestCaseGroup* binaryPersistenceGroup = new TestCaseGroup(m_context, "binary_persistence", "Program binary persistence tests");
			programBinaryGroup->addChild(binaryPersistenceGroup);

			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceDetachShaderCase>		(binaryPersistenceGroup,	m_context,	"detach_shader",	"detach shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceReattachShaderCase>		(binaryPersistenceGroup,	m_context,	"reattach_shader",	"reattach shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceDeleteShaderCase>		(binaryPersistenceGroup,	m_context,	"delete_shader",	"delete shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceReplaceShaderCase>		(binaryPersistenceGroup,	m_context,	"replace_shader",	"replace shader object");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceRecompileShaderCase>	(binaryPersistenceGroup,	m_context,	"recompile_shader",	"recompile shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceReplaceSourceCase>		(binaryPersistenceGroup,	m_context,	"replace_source",	"replace shader source");
		}
	}
}